

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.tpl.h
# Opt level: O0

Image<r_code::ImageImpl> * r_code::Image<r_code::ImageImpl>::Read(ifstream *stream)

{
  uint64_t uVar1;
  ulong uVar2;
  ostream *this;
  Image<r_code::ImageImpl> *this_00;
  long lVar3;
  Image<r_code::ImageImpl> *image;
  size_t names_size;
  size_t code_size;
  size_t map_size;
  uint64_t timestamp;
  ifstream *stream_local;
  
  timestamp = (uint64_t)stream;
  uVar2 = std::ifstream::is_open();
  if ((uVar2 & 1) == 0) {
    this = std::operator<<((ostream *)&std::cerr,"Can\'t read from non-open file");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    stream_local = (ifstream *)0x0;
  }
  else {
    std::istream::read((char *)timestamp,(long)&map_size);
    std::istream::read((char *)timestamp,(long)&code_size);
    std::istream::read((char *)timestamp,(long)&names_size);
    std::istream::read((char *)timestamp,(long)&image);
    this_00 = Build(map_size,code_size,names_size,(size_t)image);
    uVar1 = timestamp;
    lVar3 = r_code::ImageImpl::data();
    get_size(this_00);
    std::istream::read((char *)uVar1,lVar3);
    stream_local = (ifstream *)this_00;
  }
  return (Image<r_code::ImageImpl> *)stream_local;
}

Assistant:

Image<I> *Image<I>::Read(std::ifstream &stream)
{
    if (!stream.is_open()) {
        std::cerr << "Can't read from non-open file" << std::endl;
        return nullptr;
    }

    uint64_t timestamp;
    size_t map_size;
    size_t code_size;
    size_t names_size;
    stream.read((char *)&timestamp, sizeof(uint64_t));
    stream.read((char *)&map_size, sizeof(size_t));
    stream.read((char *)&code_size, sizeof(size_t));
    stream.read((char *)&names_size, sizeof(size_t));
    Image *image = Build(timestamp, map_size, code_size, names_size);
    stream.read((char *)image->data(), image->get_size() * sizeof(uint32_t));
    return image;
}